

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O0

void av1_lowbd_fwd_txfm2d_4x8_sse2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int8_t iVar1;
  int8_t iVar2;
  int8_t *piVar3;
  int iVar4;
  int iVar5;
  byte in_CL;
  int in_EDX;
  int16_t *in_RDI;
  int lr_flip;
  int ud_flip;
  transform_1d_sse2 row_txfm;
  transform_1d_sse2 col_txfm;
  int height;
  int width;
  int cos_bit_row;
  int cos_bit_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i *buf;
  __m128i buf1 [8];
  __m128i buf0 [8];
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  transform_1d_sse2 p_Var6;
  transform_1d_sse2 out;
  undefined4 uVar7;
  undefined4 uVar8;
  __m128i *local_130;
  longlong local_128 [16];
  longlong local_a8 [18];
  byte local_15;
  int local_14;
  int16_t *local_8;
  
  piVar3 = av1_fwd_txfm_shift_ls[5];
  local_15 = in_CL;
  local_14 = in_EDX;
  local_8 = in_RDI;
  iVar4 = get_txw_idx('\x05');
  iVar5 = get_txh_idx('\x05');
  iVar1 = av1_fwd_cos_bit_col[iVar4][iVar5];
  iVar2 = av1_fwd_cos_bit_row[iVar4][iVar5];
  uVar8 = 4;
  uVar7 = 8;
  out = col_txfm4x8_arr[local_15];
  p_Var6 = row_txfm8x4_arr[local_15];
  get_flip_cfg(local_15,(int *)&stack0xfffffffffffffe9c,(int *)&stack0xfffffffffffffe98);
  if (in_stack_fffffffffffffe9c == 0) {
    load_buffer_16bit_to_16bit_w4(local_8,local_14,(__m128i *)local_a8,8);
  }
  else {
    load_buffer_16bit_to_16bit_w4_flip(local_8,local_14,(__m128i *)local_a8,8);
  }
  round_shift_16bit((__m128i *)local_a8,8,(int)*piVar3);
  (*out)((__m128i *)local_a8,(__m128i *)local_a8,iVar1);
  round_shift_16bit((__m128i *)local_a8,8,(int)piVar3[1]);
  transpose_16bit_4x8((__m128i *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                      (__m128i *)0xb2eae4);
  if (in_stack_fffffffffffffe98 == 0) {
    local_130 = (__m128i *)local_128;
  }
  else {
    local_130 = (__m128i *)local_a8;
    flip_buf_sse2((__m128i *)local_128,local_130,4);
  }
  (*p_Var6)(local_130,local_130,iVar2);
  round_shift_16bit(local_130,4,(int)piVar3[2]);
  store_rect_buffer_16bit_to_32bit_w8
            ((__m128i *)CONCAT44(uVar8,uVar7),(int32_t *)out,(int)((ulong)p_Var6 >> 0x20),
             (int)p_Var6);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_4x8_sse2(const int16_t *input, int32_t *output,
                                   int stride, TX_TYPE tx_type, int bd) {
  (void)stride;
  (void)bd;
  __m128i buf0[8], buf1[8], *buf;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_4X8];
  const int txw_idx = get_txw_idx(TX_4X8);
  const int txh_idx = get_txh_idx(TX_4X8);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 4;
  const int height = 8;
  const transform_1d_sse2 col_txfm = col_txfm4x8_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x4_arr[tx_type];
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  if (ud_flip) {
    load_buffer_16bit_to_16bit_w4_flip(input, stride, buf0, height);
  } else {
    load_buffer_16bit_to_16bit_w4(input, stride, buf0, height);
  }
  round_shift_16bit(buf0, height, shift[0]);
  col_txfm(buf0, buf0, cos_bit_col);
  round_shift_16bit(buf0, height, shift[1]);
  transpose_16bit_4x8(buf0, buf1);

  if (lr_flip) {
    buf = buf0;
    flip_buf_sse2(buf1, buf, width);
  } else {
    buf = buf1;
  }
  row_txfm(buf, buf, cos_bit_row);
  round_shift_16bit(buf, width, shift[2]);
  store_rect_buffer_16bit_to_32bit_w8(buf, output, height, width);
}